

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_extensions.cpp
# Opt level: O3

void CATCH2_INTERNAL_TEMPLATE_TEST_30<true,int&&>(void)

{
  StringRef message;
  StringRef macroName;
  AssertionHandler catchAssertionHandler;
  ReusableStringStream local_88;
  string local_70;
  AssertionHandler local_50;
  
  local_70._M_dataplus._M_p =
       "/workspace/llm4binary/github/license_all_cmakelists_25/DNKpp[P]Simple-Utility/tests/concepts/stl_extensions.cpp"
  ;
  local_70._M_string_length = 0xe4;
  macroName.m_size = 7;
  macroName.m_start = "SUCCEED";
  Catch::AssertionHandler::AssertionHandler
            (&local_50,macroName,(SourceLineInfo *)&local_70,(StringRef)ZEXT816(0x46a36f),
             ContinueOnFailure);
  local_88.m_index = 0;
  local_88.m_oss = (ostream *)0x0;
  Catch::ReusableStringStream::ReusableStringStream(&local_88);
  std::__ostream_insert<char,std::char_traits<char>>(local_88.m_oss,"expected == reference<T>",0x18)
  ;
  Catch::ReusableStringStream::str_abi_cxx11_(&local_70,&local_88);
  message.m_size = local_70._M_string_length;
  message.m_start = local_70._M_dataplus._M_p;
  Catch::AssertionHandler::handleMessage(&local_50,Ok,message);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  Catch::ReusableStringStream::~ReusableStringStream(&local_88);
  Catch::AssertionHandler::complete(&local_50);
  if (local_50.m_completed == false) {
    (*(local_50.m_resultCapture)->_vptr_IResultCapture[0x14])();
  }
  return;
}

Assistant:

target_t(int)
	{
	}